

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnElseExpr(BinaryReaderInterp *this)

{
  Offset fixup_offset;
  bool bVar1;
  Result result;
  Offset OVar2;
  Label *pLVar3;
  Offset fixup_cond_offset;
  Label *label;
  BinaryReaderInterp *this_local;
  
  result = SharedValidator::OnElse
                     (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    pLVar3 = TopLabel(this);
    fixup_offset = pLVar3->fixup_offset;
    Istream::Emit(this->istream_,Br);
    OVar2 = Istream::EmitFixupU32(this->istream_);
    pLVar3->fixup_offset = OVar2;
    Istream::ResolveFixupU32(this->istream_,fixup_offset);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnElseExpr() {
  CHECK_RESULT(validator_.OnElse(loc));
  Label* label = TopLabel();
  Istream::Offset fixup_cond_offset = label->fixup_offset;
  istream_.Emit(Opcode::Br);
  label->fixup_offset = istream_.EmitFixupU32();
  istream_.ResolveFixupU32(fixup_cond_offset);
  return Result::Ok;
}